

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O2

void __thiscall
CVmObjDict::restore_from_file(CVmObjDict *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  CVmHashTable *this_00;
  vmdict_TrieNode *this_01;
  vm_obj_id_t vVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  vm_obj_id_t obj;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  size_t buflen;
  bool bVar9;
  char buf [256];
  
  pcVar5 = (this->super_CVmObject).ext_;
  this_00 = *(CVmHashTable **)(pcVar5 + 0x10);
  if (this_00 != (CVmHashTable *)0x0) {
    CVmHashTable::~CVmHashTable(this_00);
    operator_delete(this_00,0x20);
    pcVar5 = (this->super_CVmObject).ext_;
    pcVar5[0x10] = '\0';
    pcVar5[0x11] = '\0';
    pcVar5[0x12] = '\0';
    pcVar5[0x13] = '\0';
    pcVar5[0x14] = '\0';
    pcVar5[0x15] = '\0';
    pcVar5[0x16] = '\0';
    pcVar5[0x17] = '\0';
    pcVar5 = (this->super_CVmObject).ext_;
  }
  this_01 = *(vmdict_TrieNode **)(pcVar5 + 0x38);
  if (this_01 != (vmdict_TrieNode *)0x0) {
    vmdict_TrieNode::~vmdict_TrieNode(this_01);
    operator_delete(this_01,0x18);
    pcVar5 = (this->super_CVmObject).ext_;
    pcVar5[0x38] = '\0';
    pcVar5[0x39] = '\0';
    pcVar5[0x3a] = '\0';
    pcVar5[0x3b] = '\0';
    pcVar5[0x3c] = '\0';
    pcVar5[0x3d] = '\0';
    pcVar5[0x3e] = '\0';
    pcVar5[0x3f] = '\0';
  }
  uVar6 = CVmFile::read_uint4(fp);
  vVar1 = CVmObjFixup::get_new_id(fixups,(vm_obj_id_t)uVar6);
  create_hash_table(this);
  uVar6 = CVmFile::read_uint4(fp);
  while (bVar9 = uVar6 != 0, uVar6 = uVar6 - 1, bVar9) {
    uVar2 = CVmFile::read_uint2(fp);
    buflen = 0x100;
    if (uVar2 < 0x100) {
      buflen = (size_t)uVar2;
    }
    CVmFile::read_bytes(fp,buf,buflen);
    if (0x100 < uVar2) {
      lVar7 = CVmFile::get_pos(fp);
      CVmFile::set_pos(fp,(uVar2 - buflen) + lVar7);
    }
    uVar3 = CVmFile::read_uint2(fp);
    while (bVar9 = uVar3 != 0, uVar3 = uVar3 - 1, bVar9) {
      uVar8 = CVmFile::read_uint4(fp);
      uVar4 = CVmFile::read_uint2(fp);
      obj = CVmObjFixup::get_new_id(fixups,(vm_obj_id_t)uVar8);
      if (obj != 0) {
        add_hash_entry(this,buf,(ulong)uVar2,1,obj,(vm_prop_id_t)uVar4,0);
      }
    }
  }
  *(vm_obj_id_t *)((this->super_CVmObject).ext_ + 0x20) = vVar1;
  pcVar5 = (this->super_CVmObject).ext_;
  pcVar5[0x30] = '\0';
  pcVar5[0x31] = '\0';
  pcVar5[0x32] = '\0';
  pcVar5[0x33] = '\0';
  pcVar5 = (this->super_CVmObject).ext_;
  pcVar5[0x28] = '\0';
  pcVar5[0x29] = '\0';
  pcVar5[0x2a] = '\0';
  pcVar5[0x2b] = '\0';
  pcVar5[0x2c] = '\0';
  pcVar5[0x2d] = '\0';
  pcVar5[0x2e] = '\0';
  pcVar5[0x2f] = '\0';
  pcVar5 = (this->super_CVmObject).ext_;
  pcVar5[0x18] = '\x01';
  pcVar5[0x19] = '\0';
  pcVar5[0x1a] = '\0';
  pcVar5[0x1b] = '\0';
  pcVar5[0x1c] = '\0';
  pcVar5[0x1d] = '\0';
  pcVar5[0x1e] = '\0';
  pcVar5[0x1f] = '\0';
  CVmObjTable::request_post_load_init(&G_obj_table_X,self);
  return;
}

Assistant:

void CVmObjDict::restore_from_file(VMG_ vm_obj_id_t self,
                                   CVmFile *fp, CVmObjFixup *fixups)
{
    ulong cnt;
    vm_obj_id_t comp;

    /* delete the old hash table if we have one */
    if (get_ext()->hashtab_ != 0)
    {
        delete get_ext()->hashtab_;
        get_ext()->hashtab_ = 0;
    }

    /* delete the Trie if we have one */
    if (get_ext()->trie_ != 0)
    {
        delete get_ext()->trie_;
        get_ext()->trie_ = 0;
    }

    /* 
     *   Read the comparator and fix it up to the new object numbering
     *   scheme, but do not install it (as it might not be loaded yet).  
     */
    comp = fixups->get_new_id(vmg_ (vm_obj_id_t)fp->read_uint4());

    /* create the new, empty hash table */
    create_hash_table(vmg0_);

    /* read the number of symbols */
    cnt = fp->read_uint4();

    /* read the symbols */
    for ( ; cnt != 0 ; --cnt)
    {
        uint len;
        uint read_len;
        char buf[256];
        uint item_cnt;
        
        /* read the symbol length */
        len = fp->read_uint2();

        /* limit the reading to our buffer size */
        read_len = len;
        if (read_len > sizeof(buf))
            read_len = sizeof(buf);

        /* read the string */
        fp->read_bytes(buf, read_len);

        /* skip any extra data */
        if (len > read_len)
            fp->set_pos(fp->get_pos() + len - read_len);

        /* read the item count */
        item_cnt = fp->read_uint2();

        /* read the items */
        for ( ; item_cnt != 0 ; --item_cnt)
        {
            vm_obj_id_t obj;
            vm_prop_id_t prop;
            
            /* read the object and property ID's */
            obj = (vm_obj_id_t)fp->read_uint4();
            prop = (vm_prop_id_t)fp->read_uint2();

            /* translate the object ID through the fixup table */
            obj = fixups->get_new_id(vmg_ obj);

            /* add the entry, if it refers to a valid object */
            if (obj != VM_INVALID_OBJ)
                add_hash_entry(vmg_ buf, len, TRUE, obj, prop, FALSE);
        }
    }

    /* 
     *   install the comparator (we can't set its type yet, though, because
     *   the object might not be loaded yet) 
     */
    get_ext()->comparator_ = comp;
    set_comparator_type(vmg_ VM_INVALID_OBJ);

    /*
     *   If we had to restore it, we'll have to save it if the current state
     *   is later saved, even if we don't modify it again.  The fact that
     *   this version was saved before means this version has to be saved
     *   from now on.  
     */
    get_ext()->modified_ = TRUE;

    /* 
     *   register for post-load initialization, so that we can rebuild the
     *   hash table with the actual comparator if necessary 
     */
    G_obj_table->request_post_load_init(self);
}